

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t archive_read_support_format_rar5(archive *_a)

{
  wchar_t wVar1;
  rar5 *rar_00;
  rar5 *rar;
  archive_read *paStack_38;
  wchar_t ret;
  archive_read *ar;
  archive *_a_local;
  
  ar = (archive_read *)_a;
  _a_local._4_4_ = get_archive_read(_a,&stack0xffffffffffffffc8);
  if (_a_local._4_4_ == L'\0') {
    rar_00 = (rar5 *)malloc(0x5340);
    if (rar_00 == (rar5 *)0x0) {
      archive_set_error(&paStack_38->archive,0xc,"Can\'t allocate rar5 data");
      _a_local._4_4_ = L'\xffffffe2';
    }
    else {
      wVar1 = rar5_init(rar_00);
      if (wVar1 == L'\0') {
        _a_local._4_4_ =
             __archive_read_register_format
                       (paStack_38,rar_00,"rar5",rar5_bid,rar5_options,rar5_read_header,
                        rar5_read_data,rar5_read_data_skip,rar5_seek_data,rar5_cleanup,
                        rar5_capabilities,rar5_has_encrypted_entries);
        if (_a_local._4_4_ != L'\0') {
          rar5_cleanup(paStack_38);
        }
      }
      else {
        archive_set_error(&paStack_38->archive,0xc,"Can\'t allocate rar5 filter buffer");
        free(rar_00);
        _a_local._4_4_ = L'\xffffffe2';
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int archive_read_support_format_rar5(struct archive *_a) {
	struct archive_read* ar;
	int ret;
	struct rar5* rar;

	if(ARCHIVE_OK != (ret = get_archive_read(_a, &ar)))
		return ret;

	rar = malloc(sizeof(*rar));
	if(rar == NULL) {
		archive_set_error(&ar->archive, ENOMEM,
		    "Can't allocate rar5 data");
		return ARCHIVE_FATAL;
	}

	if(ARCHIVE_OK != rar5_init(rar)) {
		archive_set_error(&ar->archive, ENOMEM,
		    "Can't allocate rar5 filter buffer");
		free(rar);
		return ARCHIVE_FATAL;
	}

	ret = __archive_read_register_format(ar,
	    rar,
	    "rar5",
	    rar5_bid,
	    rar5_options,
	    rar5_read_header,
	    rar5_read_data,
	    rar5_read_data_skip,
	    rar5_seek_data,
	    rar5_cleanup,
	    rar5_capabilities,
	    rar5_has_encrypted_entries);

	if(ret != ARCHIVE_OK) {
		(void) rar5_cleanup(ar);
	}

	return ret;
}